

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  __int32_t **pp_Var3;
  double dVar4;
  double value;
  char c [3];
  double local_70;
  char local_68 [56];
  
  printf("Please input a value: ");
  pcVar2 = fgets(local_68,0x32,_stdin);
  if (pcVar2 != (char *)0x0) {
    do {
      iVar1 = __isoc99_sscanf(local_68,"%lf",&local_70);
      if (iVar1 != 0) {
        printf("Is this value in celsius or fahrenheit? [C/f] ");
        pcVar2 = fgets(local_68,3,_stdin);
        if (pcVar2 != (char *)0x0) {
          pp_Var3 = __ctype_toupper_loc();
          if (((long)local_68[0] == 10) || ((*pp_Var3)[local_68[0]] == 0x43)) {
            dVar4 = (local_70 * 9.0) / 5.0 + 32.0;
            pcVar2 = anon_var_dwarf_9b;
          }
          else {
            dVar4 = ((local_70 + -32.0) * 5.0) / 9.0;
            pcVar2 = anon_var_dwarf_b1;
          }
          printf(pcVar2,local_70,dVar4);
          return 0;
        }
        break;
      }
      puts("Invalid number!");
      printf("Please input a value: ");
      pcVar2 = fgets(local_68,0x32,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  double value;

  while (true) {
    printf("Please input a value: ");
    char str[50];
    if (fgets(str, 50, stdin) == NULL) {
      printf("\n");
      return 0;
    }
    if (sscanf(str, "%lf", &value)) break;
    else printf("Invalid number!\n");
  }

  bool is_celsius;
  printf("Is this value in celsius or fahrenheit? [C/f] ");
  char c[3];
  if (fgets(c, 3, stdin) != NULL) {
    is_celsius = toupper(*c) == 'C' || *c == '\n';
  } else {
    printf("\n");
    return 0;
  }

  if (is_celsius) {
    printf("%.3lf°C = %.3lf°F\n", value, c2f(value));
  } else {
    printf("%.3lf°F = %.3lf°C\n", value, f2c(value));
  }

  return 0;
}